

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

Message __thiscall Server::Receive(Server *this)

{
  Message MVar1;
  ssize_t sVar2;
  long lStack_28;
  Message msg;
  
  lStack_28 = 0;
  msg.scalar1 = 0;
  sVar2 = recv(this->newsockfd,&lStack_28,0x10,0);
  this->n = (int)sVar2;
  if ((int)sVar2 < 0) {
    puts("ERROR in Server reading from Client\'s socket!");
  }
  else {
    (this->msg_from_client).scalar1 = lStack_28;
    (this->msg_from_client).scalar2 = msg.scalar1;
  }
  MVar1.scalar2 = msg.scalar1;
  MVar1.scalar1 = lStack_28;
  return MVar1;
}

Assistant:

const Message Server::Receive()
{
    Message msg;
    n = recv(newsockfd, &msg, sizeof(msg), 0);
    
    if (n < 0)
        printf("ERROR in Server reading from Client's socket!\n");
    else
        msg_from_client = msg;

    return msg;
}